

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lookahead_matcher.hpp
# Opt level: O0

bool __thiscall
boost::xpressive::detail::
lookahead_matcher<boost::xpressive::detail::shared_matchable<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>
::
match_<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::xpressive::detail::matchable_ex<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>
          (void *param_1,undefined8 *param_2,long *param_3)

{
  bool bVar1;
  byte bVar2;
  ulong uVar3;
  save_restore<bool> partial_match;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  tmp;
  match_state<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffff98;
  undefined6 in_stack_ffffffffffffffa0;
  undefined1 in_stack_ffffffffffffffa6;
  undefined1 in_stack_ffffffffffffffa7;
  save_restore<bool> local_40;
  undefined8 local_30;
  long *local_28;
  undefined8 *local_20;
  void *local_18;
  byte local_9;
  save_restore<bool> *local_8;
  
  local_30 = *param_2;
  local_28 = param_3;
  local_20 = param_2;
  local_18 = param_1;
  if ((*(byte *)((long)param_1 + 8) & 1) == 0) {
    bVar1 = shared_matchable<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::match((shared_matchable<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)CONCAT17(in_stack_ffffffffffffffa7,
                                CONCAT16(in_stack_ffffffffffffffa6,in_stack_ffffffffffffffa0)),
                    in_stack_ffffffffffffff98);
    if (!bVar1) {
      local_9 = 0;
      goto LAB_0016fc98;
    }
    *local_20 = local_30;
    uVar3 = (**(code **)(*local_28 + 0x10))(local_28,local_20);
    if ((uVar3 & 1) != 0) {
      local_9 = 1;
      goto LAB_0016fc98;
    }
  }
  else {
    save_restore<bool>::save_restore(&local_40,(bool *)((long)param_2 + 0x31));
    local_8 = &local_40;
    bVar1 = shared_matchable<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::match((shared_matchable<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)CONCAT17(in_stack_ffffffffffffffa7,
                                CONCAT16(in_stack_ffffffffffffffa6,in_stack_ffffffffffffffa0)),
                    in_stack_ffffffffffffff98);
    if (bVar1) {
      *local_20 = local_30;
      local_9 = 0;
      bVar1 = true;
    }
    else {
      bVar2 = (**(code **)(*local_28 + 0x10))(local_28,local_20);
      if ((bVar2 & 1) == 0) {
        bVar1 = false;
      }
      else {
        local_9 = 1;
        bVar1 = true;
      }
    }
    save_restore<bool>::~save_restore(&local_40);
    if (bVar1) goto LAB_0016fc98;
  }
  local_9 = 0;
LAB_0016fc98:
  return (bool)(local_9 & 1);
}

Assistant:

bool match_(match_state<BidiIter> &state, Next const &next, mpl::true_) const
        {
            BidiIter const tmp = state.cur_;

            if(this->not_)
            {
                // negative look-ahead assertions do not trigger partial matches.
                save_restore<bool> partial_match(state.found_partial_match_);
                detail::ignore_unused(partial_match);

                if(this->xpr_.match(state))
                {
                    state.cur_ = tmp;
                    return false;
                }
                else if(next.match(state))
                {
                    return true;
                }
            }
            else
            {
                if(!this->xpr_.match(state))
                {
                    return false;
                }
                state.cur_ = tmp;
                if(next.match(state))
                {
                    return true;
                }
            }

            BOOST_ASSERT(state.cur_ == tmp);
            return false;
        }